

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O3

int __thiscall ncnn::Padding::load_model(Padding *this,ModelBin *mb)

{
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  void *local_58;
  int *local_50;
  size_t local_48;
  int local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  int local_20;
  size_t local_18;
  
  if (this->per_channel_pad_data_size != 0) {
    (*mb->_vptr_ModelBin[2])(&local_58,mb,(ulong)(uint)this->per_channel_pad_data_size,1);
    if (&this->per_channel_pad_data != (Mat *)&local_58) {
      if (local_50 != (int *)0x0) {
        LOCK();
        *local_50 = *local_50 + 1;
        UNLOCK();
      }
      piVar1 = (this->per_channel_pad_data).refcount;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          __ptr = (this->per_channel_pad_data).data;
          pAVar2 = (this->per_channel_pad_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->per_channel_pad_data).data = local_58;
      (this->per_channel_pad_data).refcount = local_50;
      (this->per_channel_pad_data).elemsize = local_48;
      (this->per_channel_pad_data).elempack = local_40;
      (this->per_channel_pad_data).allocator = local_38;
      (this->per_channel_pad_data).dims = local_30;
      (this->per_channel_pad_data).w = iStack_2c;
      (this->per_channel_pad_data).h = iStack_28;
      (this->per_channel_pad_data).d = iStack_24;
      (this->per_channel_pad_data).c = local_20;
      (this->per_channel_pad_data).cstep = local_18;
    }
    if (local_50 != (int *)0x0) {
      LOCK();
      *local_50 = *local_50 + -1;
      UNLOCK();
      if (*local_50 == 0) {
        if (local_38 == (Allocator *)0x0) {
          if (local_58 != (void *)0x0) {
            free(local_58);
          }
        }
        else {
          (*local_38->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Padding::load_model(const ModelBin& mb)
{
    if (per_channel_pad_data_size)
    {
        per_channel_pad_data = mb.load(per_channel_pad_data_size, 1);
    }

    return 0;
}